

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dreadhb.c
# Opt level: O2

void dreadhb(FILE *fp,int *nrow,int *ncol,int_t *nonz,double **nzval,int_t **rowind,int_t **colptr)

{
  int *piVar1;
  double dVar2;
  int_t *addr;
  double *addr_00;
  int iVar3;
  int iVar4;
  int_t *addr_01;
  int_t *addr_02;
  ulong uVar5;
  ulong uVar6;
  int_t *piVar7;
  double *pdVar8;
  long lVar9;
  void *pvVar10;
  int_t *addr_03;
  long lVar11;
  FILE *__stream;
  long lVar12;
  ulong uVar13;
  int_t *piVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  bool bVar19;
  int tmp;
  double **local_220;
  int_t *local_218;
  int_t *local_210;
  int_t *local_208;
  FILE *local_200;
  void *local_1f8;
  int valsize;
  int valnum;
  int rowsize;
  int rownum;
  int colsize;
  int colnum;
  char type [4];
  char buf [100];
  char msg [256];
  
  local_220 = nzval;
  local_200 = (FILE *)fp;
  fgets(buf,100,(FILE *)fp);
  fputs(buf,_stdout);
  iVar17 = 0;
  iVar4 = 5;
  iVar16 = 0;
  while (__stream = local_200, iVar15 = iVar4 + -1, iVar4 != 0) {
    __isoc99_fscanf(local_200,"%14c",buf);
    buf[0xe] = '\0';
    __isoc99_sscanf(buf,"%d",&tmp);
    if (iVar4 == 2) {
      iVar17 = tmp;
    }
    iVar3 = tmp;
    if (tmp == 0) {
      iVar3 = iVar16;
    }
    bVar19 = iVar4 == 1;
    iVar4 = iVar15;
    if (bVar19) {
      iVar16 = iVar3;
    }
  }
  dDumpLine((FILE *)local_200);
  __isoc99_fscanf(__stream,"%3c",type);
  __isoc99_fscanf(__stream,"%11c",buf);
  type[3] = '\0';
  __isoc99_fscanf(__stream,"%14c",buf);
  iVar4 = atoi(buf);
  *nrow = iVar4;
  __isoc99_fscanf(__stream,"%14c",buf);
  iVar4 = atoi(buf);
  *ncol = iVar4;
  __isoc99_fscanf(__stream,"%14c",buf);
  iVar4 = atoi(buf);
  *nonz = iVar4;
  __isoc99_fscanf(__stream,"%14c",buf);
  tmp = atoi(buf);
  if (tmp != 0) {
    puts("This is not an assembled matrix!");
  }
  if (*nrow != *ncol) {
    puts("Matrix is not square.");
  }
  dDumpLine((FILE *)__stream);
  dallocateA(*ncol,*nonz,local_220,rowind,colptr);
  __isoc99_fscanf(__stream,"%16c",buf);
  dParseIntFormat(buf,&colnum,&colsize);
  __isoc99_fscanf(__stream,"%16c",buf);
  dParseIntFormat(buf,&rownum,&rowsize);
  __isoc99_fscanf(__stream,"%20c",buf);
  dParseFloatFormat(buf,&valnum,&valsize);
  __isoc99_fscanf(__stream,"%20c",buf);
  dDumpLine((FILE *)__stream);
  if (iVar16 != 0) {
    dDumpLine((FILE *)__stream);
  }
  ReadVector((FILE *)__stream,*ncol + 1,*colptr,colnum,colsize);
  ReadVector((FILE *)__stream,*nonz,*rowind,rownum,rowsize);
  if (iVar17 != 0) {
    dReadValues((FILE *)__stream,*nonz,*local_220,valnum,valsize);
  }
  if ((type[1] & 0xdfU) == 0x53) {
    uVar18 = *ncol;
    addr_03 = *rowind;
    addr = *colptr;
    addr_00 = *local_220;
    iVar17 = uVar18 + 1;
    addr_01 = intMalloc(iVar17);
    local_210 = addr_03;
    if (addr_01 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0xcb,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadhb.c");
      superlu_abort_and_exit(msg);
    }
    local_218 = intMalloc(iVar17);
    if (local_218 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xcd,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadhb.c");
      superlu_abort_and_exit(msg);
    }
    addr_02 = intMalloc(*nonz);
    if (addr_02 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",0xcf,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadhb.c");
      superlu_abort_and_exit(msg);
    }
    local_1f8 = superlu_malloc((long)*nonz << 3);
    if (local_1f8 == (void *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_val[]",0xd1,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadhb.c");
      superlu_abort_and_exit(msg);
    }
    uVar5 = 0;
    uVar13 = 0;
    if (0 < (int)uVar18) {
      uVar13 = (ulong)uVar18;
    }
    for (; uVar13 != uVar5; uVar5 = uVar5 + 1) {
      addr_01[uVar5] = 0;
    }
    uVar5 = 0;
    while (uVar5 != uVar13) {
      piVar1 = addr + uVar5;
      uVar5 = uVar5 + 1;
      for (lVar9 = (long)*piVar1; lVar9 < addr[uVar5]; lVar9 = lVar9 + 1) {
        addr_01[addr_03[lVar9]] = addr_01[addr_03[lVar9]] + 1;
      }
    }
    *local_218 = 0;
    for (uVar5 = 0; uVar13 != uVar5; uVar5 = uVar5 + 1) {
      local_218[uVar5 + 1] = addr_01[uVar5] + local_218[uVar5];
      addr_01[uVar5] = local_218[uVar5];
    }
    uVar5 = 0;
    while (uVar6 = uVar5, uVar6 != uVar13) {
      for (lVar9 = (long)addr[uVar6]; uVar5 = uVar6 + 1, lVar9 < addr[uVar6 + 1]; lVar9 = lVar9 + 1)
      {
        iVar4 = addr_03[lVar9];
        addr_02[addr_01[iVar4]] = (int_t)uVar6;
        iVar16 = addr_01[iVar4];
        *(double *)((long)local_1f8 + (long)iVar16 * 8) = addr_00[lVar9];
        addr_01[iVar4] = iVar16 + 1;
      }
    }
    lVar9 = (long)*nonz * 2 - (long)(int)uVar18;
    local_208 = intMalloc(iVar17);
    if (local_208 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC a_colptr[]",0xea,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadhb.c");
      superlu_abort_and_exit(msg);
    }
    piVar7 = intMalloc((int_t)lVar9);
    if (piVar7 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_rowind[]",0xec,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadhb.c");
      superlu_abort_and_exit(msg);
    }
    pdVar8 = (double *)superlu_malloc(lVar9 * 8);
    if (pdVar8 == (double *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_val[]",0xee,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadhb.c");
      superlu_abort_and_exit(msg);
    }
    *local_208 = 0;
    uVar18 = 0;
    piVar14 = local_218;
    uVar5 = 0;
    while (pvVar10 = local_1f8, uVar5 != uVar13) {
      uVar6 = uVar5 + 1;
      for (lVar11 = (long)piVar14[uVar5]; lVar11 < piVar14[uVar6]; lVar11 = lVar11 + 1) {
        if (uVar5 != (uint)addr_02[lVar11]) {
          piVar7[(int)uVar18] = addr_02[lVar11];
          dVar2 = *(double *)((long)pvVar10 + lVar11 * 8);
          pdVar8[(int)uVar18] = dVar2;
          if (ABS(dVar2) < 4.047e-300) {
            printf("%5d: %e\n",(ulong)uVar18);
            pvVar10 = local_1f8;
            piVar14 = local_218;
          }
          uVar18 = uVar18 + 1;
        }
      }
      lVar11 = (long)addr[uVar5];
      for (lVar12 = 0; lVar11 + lVar12 < (long)addr[uVar6]; lVar12 = lVar12 + 1) {
        piVar7[(int)uVar18 + lVar12] = local_210[lVar11 + lVar12];
        pdVar8[(int)uVar18 + lVar12] = addr_00[lVar11 + lVar12];
      }
      uVar18 = uVar18 + (int)lVar12;
      local_208[uVar6] = uVar18;
      addr_03 = local_210;
      uVar5 = uVar6;
    }
    printf("FormFullA: new_nnz = %lld\n",lVar9);
    superlu_free(addr_00);
    superlu_free(addr_03);
    superlu_free(addr);
    superlu_free(addr_01);
    superlu_free(pvVar10);
    superlu_free(addr_02);
    superlu_free(local_218);
    *local_220 = pdVar8;
    *rowind = piVar7;
    *colptr = local_208;
    *nonz = (int_t)lVar9;
    __stream = local_200;
  }
  fclose(__stream);
  return;
}

Assistant:

void
dreadhb(FILE *fp, int *nrow, int *ncol, int_t *nonz,
	double **nzval, int_t **rowind, int_t **colptr)
{

    register int i, numer_lines = 0, rhscrd = 0;
    int tmp, colnum, colsize, rownum, rowsize, valnum, valsize;
    char buf[100], type[4];
    int sym;

    /* Line 1 */
    fgets(buf, 100, fp);
    fputs(buf, stdout);

    /* Line 2 */
    for (i=0; i<5; i++) {
	fscanf(fp, "%14c", buf); buf[14] = 0;
	sscanf(buf, "%d", &tmp);
	if (i == 3) numer_lines = tmp;
	if (i == 4 && tmp) rhscrd = tmp;
    }
    dDumpLine(fp);

    /* Line 3 */
    fscanf(fp, "%3c", type);
    fscanf(fp, "%11c", buf); /* pad */
    type[3] = 0;
#if ( DEBUGlevel>=1 )
    printf("Matrix type %s\n", type);
#endif
    
    fscanf(fp, "%14c", buf); *nrow = atoi(buf);
    fscanf(fp, "%14c", buf); *ncol = atoi(buf);
    fscanf(fp, "%14c", buf); *nonz = atoi(buf);
    fscanf(fp, "%14c", buf); tmp = atoi(buf);
    
    if (tmp != 0)
	  printf("This is not an assembled matrix!\n");
    if (*nrow != *ncol)
	printf("Matrix is not square.\n");
    dDumpLine(fp);

    /* Allocate storage for the three arrays ( nzval, rowind, colptr ) */
    dallocateA(*ncol, *nonz, nzval, rowind, colptr);

    /* Line 4: format statement */
    fscanf(fp, "%16c", buf);
    dParseIntFormat(buf, &colnum, &colsize);
    fscanf(fp, "%16c", buf);
    dParseIntFormat(buf, &rownum, &rowsize);
    fscanf(fp, "%20c", buf);
    dParseFloatFormat(buf, &valnum, &valsize);
    fscanf(fp, "%20c", buf);
    dDumpLine(fp);

    /* Line 5: right-hand side */    
    if ( rhscrd ) dDumpLine(fp); /* skip RHSFMT */
    
#ifdef DEBUG
    printf("%d rows, %lld nonzeros\n", *nrow, (long long) *nonz);
    printf("colnum %d, colsize %d\n", colnum, colsize);
    printf("rownum %d, rowsize %d\n", rownum, rowsize);
    printf("valnum %d, valsize %d\n", valnum, valsize);
#endif
    
    ReadVector(fp, *ncol+1, *colptr, colnum, colsize);
    ReadVector(fp, *nonz, *rowind, rownum, rowsize);
    if ( numer_lines ) {
        dReadValues(fp, *nonz, *nzval, valnum, valsize);
    }
    
    sym = (type[1] == 'S' || type[1] == 's');
    if ( sym ) {
	FormFullA(*ncol, nonz, nzval, rowind, colptr);
    }

    fclose(fp);
}